

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicArray.hpp
# Opt level: O3

void __thiscall
stick::DynamicArray<stick::String>::reserve(DynamicArray<stick::String> *this,Size _s)

{
  Allocator *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  long lVar5;
  Size extraout_RDX;
  ulong uVar6;
  long *plVar7;
  Size i;
  Size SVar8;
  long local_48;
  long local_40;
  Size local_38;
  void *pvVar3;
  
  if ((this->m_data).size >> 5 < _s) {
    pAVar1 = this->m_allocator;
    if (pAVar1 == (Allocator *)0x0) {
      __assert_fail("m_allocator",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/DynamicArray.hpp"
                    ,0x87,
                    "void stick::DynamicArray<stick::String>::reserve(Size) [T = stick::String]");
    }
    iVar2 = (*pAVar1->_vptr_Allocator[2])(pAVar1,_s << 5,8);
    pvVar3 = (void *)CONCAT44(extraout_var,iVar2);
    if (pvVar3 == (void *)0x0) {
      __assert_fail("blk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/DynamicArray.hpp"
                    ,0x89,
                    "void stick::DynamicArray<stick::String>::reserve(Size) [T = stick::String]");
    }
    plVar7 = (long *)(this->m_data).ptr;
    uVar4 = this->m_count;
    SVar8 = extraout_RDX;
    if (uVar4 != 0) {
      lVar5 = 0;
      uVar6 = uVar4;
      do {
        *(undefined8 *)((long)pvVar3 + lVar5) = *(undefined8 *)((long)plVar7 + lVar5);
        *(undefined8 *)((long)pvVar3 + lVar5 + 8) = *(undefined8 *)((long)plVar7 + lVar5 + 8);
        *(undefined8 *)((long)pvVar3 + lVar5 + 0x10) = *(undefined8 *)((long)plVar7 + lVar5 + 0x10);
        *(undefined8 *)((long)pvVar3 + lVar5 + 0x18) = *(undefined8 *)((long)plVar7 + lVar5 + 0x18);
        *(undefined8 *)((long)plVar7 + lVar5) = 0;
        lVar5 = lVar5 + 0x20;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      uVar6 = 0;
      local_38 = extraout_RDX;
      do {
        if (*plVar7 != 0) {
          local_40 = plVar7[2] + 1;
          local_48 = *plVar7;
          (**(code **)(*(long *)plVar7[3] + 0x18))((long *)plVar7[3],&local_48);
          *plVar7 = 0;
          plVar7[1] = 0;
          plVar7[2] = 0;
          uVar4 = this->m_count;
        }
        uVar6 = uVar6 + 1;
        plVar7 = plVar7 + 4;
      } while (uVar6 < uVar4);
      plVar7 = (long *)(this->m_data).ptr;
      SVar8 = local_38;
    }
    if (plVar7 != (long *)0x0) {
      (*this->m_allocator->_vptr_Allocator[3])(this->m_allocator,this);
    }
    (this->m_data).ptr = pvVar3;
    (this->m_data).size = SVar8;
  }
  return;
}

Assistant:

inline void reserve(Size _s)
    {
        auto c = capacity();
        if (_s > c)
        {
            STICK_ASSERT(m_allocator);
            auto blk = m_allocator->allocate(_s * sizeof(T), alignof(T));
            STICK_ASSERT(blk);
            T * arrayPtr = reinterpret_cast<T *>(blk.ptr);
            T * sourcePtr = reinterpret_cast<T *>(m_data.ptr);

            // move the existing elements over
            for (Size i = 0; i < m_count; ++i)
            {
                new (arrayPtr + i) T(std::move(sourcePtr[i]));
            }

            // call the destructors on the old elements
            for (Size i = 0; i < m_count; ++i)
            {
                sourcePtr[i].~T();
            }

            if (m_data)
                m_allocator->deallocate(m_data);

            m_data = blk;
        }
    }